

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::set_apply_ip_filter(torrent *this,bool b)

{
  if (((this->field_0x5db & 2) == 0) != b) {
    return;
  }
  inc_stats_counter(this,0xdb,-(uint)b | 1);
  set_need_save_resume(this,(resume_data_flags_t)0x20);
  *(uint *)&this->field_0x5d8 = *(uint *)&this->field_0x5d8 & 0xfdffffff | (uint)b << 0x19;
  ip_filter_updated(this);
  state_updated(this);
  return;
}

Assistant:

void torrent::set_apply_ip_filter(bool b)
	{
		if (b == m_apply_ip_filter) return;
		if (b)
		{
			inc_stats_counter(counters::non_filter_torrents, -1);
		}
		else
		{
			inc_stats_counter(counters::non_filter_torrents);
		}

		set_need_save_resume(torrent_handle::if_config_changed);

		m_apply_ip_filter = b;
		ip_filter_updated();
		state_updated();
	}